

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BinaryDecoder *coder)

{
  undefined1 auVar1 [16];
  BinaryDecoder *this_00;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  FileInfo *pFVar5;
  StringList *__nbytes;
  void *__buf;
  FileInfo *local_60;
  uint8_t *local_38;
  StringList local_30;
  uint local_1c;
  BinaryDecoder *pBStack_18;
  uint32_t i;
  BinaryDecoder *coder_local;
  BuildValue *this_local;
  
  this->kind = Invalid;
  this->numOutputInfos = 0;
  pBStack_18 = coder;
  coder_local = (BinaryDecoder *)this;
  llbuild::basic::CommandSignature::CommandSignature(&this->signature);
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.checksum.bytes[0] = '\0';
  local_38 = (this->valueData).asOutputInfo.checksum.bytes + 1;
  __nbytes = &this->stringValues;
  do {
    *local_38 = '\0';
    local_38 = local_38 + 1;
  } while ((StringList *)local_38 != __nbytes);
  llbuild::basic::StringList::StringList(&this->stringValues);
  bVar2 = llbuild::basic::BinaryDecoder::isEmpty(pBStack_18);
  if (bVar2) {
    this->kind = Invalid;
  }
  else {
    llbuild::basic::BinaryDecoder::read<llbuild::buildsystem::BuildValue::Kind>
              (pBStack_18,&this->kind);
    bVar2 = kindHasSignature(this);
    if (bVar2) {
      llbuild::basic::BinaryDecoder::read<llbuild::basic::CommandSignature>
                (pBStack_18,&this->signature);
    }
    bVar2 = kindHasOutputInfo(this);
    if (bVar2) {
      llbuild::basic::BinaryDecoder::read(pBStack_18,(int)this + 4,__buf,(size_t)__nbytes);
      if (1 < this->numOutputInfos) {
        uVar3 = CONCAT44(0,this->numOutputInfos);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x50),0);
        if (SUB168(auVar1 * ZEXT816(0x50),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        pFVar5 = (FileInfo *)operator_new__(uVar4);
        if (uVar3 != 0) {
          local_60 = pFVar5;
          do {
            llbuild::basic::FileInfo::FileInfo(local_60);
            local_60 = local_60 + 1;
          } while (local_60 != pFVar5 + uVar3);
        }
        (this->valueData).asOutputInfos = pFVar5;
      }
      for (local_1c = 0; this_00 = pBStack_18, local_1c != this->numOutputInfos;
          local_1c = local_1c + 1) {
        pFVar5 = getNthOutputInfo(this,local_1c);
        llbuild::basic::BinaryDecoder::read<llbuild::basic::FileInfo>(this_00,pFVar5);
      }
    }
    bVar2 = kindHasStringList(this);
    if (bVar2) {
      llbuild::basic::StringList::StringList(&local_30,pBStack_18);
      llbuild::basic::StringList::operator=(&this->stringValues,&local_30);
      llbuild::basic::StringList::~StringList(&local_30);
    }
    llbuild::basic::BinaryDecoder::finish(pBStack_18);
  }
  return;
}

Assistant:

inline buildsystem::BuildValue::BuildValue(basic::BinaryDecoder& coder) {
  // Handle empty decode requests.
  if (coder.isEmpty()) {
    kind = BuildValue::Kind::Invalid;
    return;
  }
  
  coder.read(kind);
  if (kindHasSignature())
    coder.read(signature);
  if (kindHasOutputInfo()) {
    coder.read(numOutputInfos);
    if (numOutputInfos > 1) {
      valueData.asOutputInfos = new FileInfo[numOutputInfos];
    }
    for (uint32_t i = 0; i != numOutputInfos; ++i) {
      coder.read(getNthOutputInfo(i));
    }
  }
  if (kindHasStringList()) {
    stringValues = basic::StringList(coder);
  }
  coder.finish();
}